

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_vocab.c
# Opt level: O0

HashVocab HashVocab_init_from_bin(char *mem)

{
  HashVocab pHVar1;
  HashVocab voc;
  char *mem_local;
  
  pHVar1 = (HashVocab)malloc(0x48);
  pHVar1->bound_ = *(size_t *)mem;
  (pHVar1->tb).buckets_ = *(size_t *)(mem + 8);
  if (pHVar1->bound_ == 0) {
    __assert_fail("voc->bound_ != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/chenkovsky[P]ngram/hash_vocab.c"
                  ,0x47,"HashVocab HashVocab_init_from_bin(const char *)");
  }
  if ((pHVar1->tb).buckets_ != 0) {
    (pHVar1->tb).begin_ = (ProbingVocabularyEntry_T *)(mem + 0x10);
    (pHVar1->tb).end_ = (pHVar1->tb).begin_ + (pHVar1->tb).buckets_;
    pHVar1->words = (uint32_t *)(pHVar1->tb).end_;
    pHVar1->word_strs = (char *)(pHVar1->words + pHVar1->bound_);
    pHVar1->init_from_bin = 0xffffffffffffffff;
    return pHVar1;
  }
  __assert_fail("voc->tb.buckets_ != 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/chenkovsky[P]ngram/hash_vocab.c"
                ,0x48,"HashVocab HashVocab_init_from_bin(const char *)");
}

Assistant:

HashVocab HashVocab_init_from_bin(const char* mem){
    //init_unknown_hash();
    HashVocab voc = malloc(sizeof(struct HashVocab_T));
#define READ(ret, typ, ptr) ret =*(typ *)ptr;\
                            ptr+=sizeof(typ);
    READ(voc->bound_ , size_t , mem)
    READ(voc->tb.buckets_ , size_t, mem)
    assert(voc->bound_ != 0);
    assert(voc->tb.buckets_ != 0);
    //printf("voc->bound_:%zu\n",voc->bound_ );
    //printf("voc->tb.buckets_:%zu\n", voc->tb.buckets_ );
    voc->tb.begin_ = (ProbingVocabularyEntry_T*)mem;
    voc->tb.end_ = voc->tb.begin_ + voc->tb.buckets_;
    mem = (char*)voc->tb.end_;
    voc->words = (uint32_t*)mem;
    mem = (char*)(voc->words + voc->bound_);
    voc->word_strs = (char*)mem;
    voc->init_from_bin = (size_t)-1;//init_from_bin is true
#undef READ
    return voc;
}